

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

string_view __thiscall libtorrent::torrent_info::ssl_cert(torrent_info *this)

{
  bdecode_node *this_00;
  char *start;
  bool bVar1;
  type_t tVar2;
  string_view sVar3;
  error_code ec;
  error_code local_30;
  
  if (((this->m_flags).m_val & 8) != 0) {
    this_00 = &this->m_info_dict;
    bVar1 = bdecode_node::operator_cast_to_bool(this_00);
    if (!bVar1) {
      local_30.val_ = 0;
      local_30.failed_ = false;
      local_30.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      start = (this->m_info_section).px;
      bdecode(start,start + this->m_info_section_size,this_00,&local_30,(int *)0x0,100,2000000);
      if (local_30.failed_ != false) {
        return (string_view)(ZEXT816(0x3eda7b) << 0x40);
      }
    }
    tVar2 = bdecode_node::type(this_00);
    if (tVar2 == dict_t) {
      sVar3._M_str = "ssl-cert";
      sVar3._M_len = 8;
      sVar3 = bdecode_node::dict_find_string_value(this_00,sVar3,(string_view)ZEXT816(0));
      return sVar3;
    }
  }
  return (string_view)(ZEXT816(0x3eda7b) << 0x40);
}

Assistant:

string_view torrent_info::ssl_cert() const
	{
		if (!(m_flags & ssl_torrent)) return "";

		// this is parsed lazily
		if (!m_info_dict)
		{
			error_code ec;
			bdecode(m_info_section.get(), m_info_section.get()
				+ m_info_section_size, m_info_dict, ec);
			TORRENT_ASSERT(!ec);
			if (ec) return "";
		}
		TORRENT_ASSERT(m_info_dict.type() == bdecode_node::dict_t);
		if (m_info_dict.type() != bdecode_node::dict_t) return "";
		return m_info_dict.dict_find_string_value("ssl-cert");
	}